

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

void __thiscall benchmark::internal::Benchmark::Benchmark(Benchmark *this,char *name)

{
  BenchmarkImp *this_00;
  allocator local_19;
  
  this->_vptr_Benchmark = (_func_int **)&PTR__Benchmark_00129820;
  this_00 = (BenchmarkImp *)operator_new(0x68);
  std::__cxx11::string::string((string *)this_00,name,&local_19);
  this_00->arg_count_ = -1;
  (this_00->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->args_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->args_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->args_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->min_time_ = 0.0;
  this_00->use_real_time_ = false;
  this->imp_ = this_00;
  return;
}

Assistant:

Benchmark::Benchmark(const char* name)
    : imp_(new BenchmarkImp(name))
{
}